

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::fixup_implicit_builtin_block_names
          (CompilerGLSL *this,ExecutionModel model)

{
  uint id;
  ID IVar1;
  BuiltIn BVar2;
  bool bVar3;
  bool bVar4;
  SPIRVariable *var;
  SPIRType *pSVar5;
  Meta *pMVar6;
  long lVar7;
  allocator local_bd;
  ID local_bc;
  ExecutionModel local_b8;
  ExecutionModel local_b4;
  string local_b0;
  ParsedIR *local_90;
  LoopLock local_88;
  TypedID<(spirv_cross::Types)0> *local_80;
  long local_78;
  Bitset flags;
  
  local_90 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_90);
  local_80 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_78 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2;
  lVar7 = 0;
  local_b4 = model ^ ExecutionModelMeshEXT;
  local_b8 = model;
  do {
    if (local_78 == lVar7) {
      ParsedIR::LoopLock::~LoopLock(&local_88);
      return;
    }
    id = *(uint *)((long)&local_80->id + lVar7);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type ==
        TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(local_90,id);
      pSVar5 = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
      bVar3 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(pSVar5->super_IVariant).self.id,DecorationBlock)
      ;
      if (((var->storage | StorageClassUniform) == StorageClassOutput) && (bVar3)) {
        bVar4 = Compiler::is_builtin_variable(&this->super_Compiler,var);
        if (bVar4) {
          if (local_b8 == ExecutionModelMeshEXT) {
            Compiler::get_buffer_block_flags
                      (&flags,&this->super_Compiler,(VariableID)(var->super_IVariant).self.id);
            bVar4 = Bitset::get(&flags,0x1497);
            local_bc.id = (var->super_IVariant).self.id;
            if (bVar4) {
              ::std::__cxx11::string::string((string *)&local_b0,"gl_MeshPrimitivesEXT",&local_bd);
              Compiler::set_name(&this->super_Compiler,local_bc,&local_b0);
              ::std::__cxx11::string::~string((string *)&local_b0);
              IVar1.id = (pSVar5->super_IVariant).self.id;
              ::std::__cxx11::string::string((string *)&local_b0,"gl_MeshPerPrimitiveEXT",&local_bd)
              ;
              Compiler::set_name(&this->super_Compiler,IVar1,&local_b0);
            }
            else {
              ::std::__cxx11::string::string((string *)&local_b0,"gl_MeshVerticesEXT",&local_bd);
              Compiler::set_name(&this->super_Compiler,local_bc,&local_b0);
              ::std::__cxx11::string::~string((string *)&local_b0);
              IVar1.id = (pSVar5->super_IVariant).self.id;
              ::std::__cxx11::string::string((string *)&local_b0,"gl_MeshPerVertexEXT",&local_bd);
              Compiler::set_name(&this->super_Compiler,IVar1,&local_b0);
            }
            ::std::__cxx11::string::~string((string *)&local_b0);
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&flags.higher._M_h);
          }
          else {
            if (var->storage == StorageClassInput) {
              IVar1.id = (var->super_IVariant).self.id;
              ::std::__cxx11::string::string((string *)&flags,"gl_in",(allocator *)&local_b0);
              Compiler::set_name(&this->super_Compiler,IVar1,(string *)&flags);
            }
            else {
              if (var->storage != StorageClassOutput) goto LAB_0025c0e8;
              IVar1.id = (var->super_IVariant).self.id;
              ::std::__cxx11::string::string((string *)&flags,"gl_out",(allocator *)&local_b0);
              Compiler::set_name(&this->super_Compiler,IVar1,(string *)&flags);
            }
            ::std::__cxx11::string::~string((string *)&flags);
          }
        }
      }
LAB_0025c0e8:
      if (!bVar3 && (var->storage == StorageClassOutput && local_b4 == ExecutionModelVertex)) {
        pMVar6 = ParsedIR::find_meta(local_90,(ID)(var->super_IVariant).self.id);
        if ((pMVar6 != (Meta *)0x0) && ((pMVar6->decoration).builtin == true)) {
          BVar2 = (pMVar6->decoration).builtin_type;
          if (BVar2 == BuiltInPrimitiveTriangleIndicesEXT) {
            IVar1.id = (var->super_IVariant).self.id;
            ::std::__cxx11::string::string
                      ((string *)&flags,"gl_PrimitiveTriangleIndicesEXT",(allocator *)&local_b0);
            Compiler::set_name(&this->super_Compiler,IVar1,(string *)&flags);
          }
          else if (BVar2 == BuiltInPrimitiveLineIndicesEXT) {
            IVar1.id = (var->super_IVariant).self.id;
            ::std::__cxx11::string::string
                      ((string *)&flags,"gl_PrimitiveLineIndicesEXT",(allocator *)&local_b0);
            Compiler::set_name(&this->super_Compiler,IVar1,(string *)&flags);
          }
          else {
            if (BVar2 != BuiltInPrimitivePointIndicesEXT) goto LAB_0025c1c0;
            IVar1.id = (var->super_IVariant).self.id;
            ::std::__cxx11::string::string
                      ((string *)&flags,"gl_PrimitivePointIndicesEXT",(allocator *)&local_b0);
            Compiler::set_name(&this->super_Compiler,IVar1,(string *)&flags);
          }
          ::std::__cxx11::string::~string((string *)&flags);
        }
      }
    }
LAB_0025c1c0:
    lVar7 = lVar7 + 4;
  } while( true );
}

Assistant:

void CompilerGLSL::fixup_implicit_builtin_block_names(ExecutionModel model)
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if ((var.storage == StorageClassOutput || var.storage == StorageClassInput) && block &&
		    is_builtin_variable(var))
		{
			if (model != ExecutionModelMeshEXT)
			{
				// Make sure the array has a supported name in the code.
				if (var.storage == StorageClassOutput)
					set_name(var.self, "gl_out");
				else if (var.storage == StorageClassInput)
					set_name(var.self, "gl_in");
			}
			else
			{
				auto flags = get_buffer_block_flags(var.self);
				if (flags.get(DecorationPerPrimitiveEXT))
				{
					set_name(var.self, "gl_MeshPrimitivesEXT");
					set_name(type.self, "gl_MeshPerPrimitiveEXT");
				}
				else
				{
					set_name(var.self, "gl_MeshVerticesEXT");
					set_name(type.self, "gl_MeshPerVertexEXT");
				}
			}
		}

		if (model == ExecutionModelMeshEXT && var.storage == StorageClassOutput && !block)
		{
			auto *m = ir.find_meta(var.self);
			if (m && m->decoration.builtin)
			{
				auto builtin_type = m->decoration.builtin_type;
				if (builtin_type == BuiltInPrimitivePointIndicesEXT)
					set_name(var.self, "gl_PrimitivePointIndicesEXT");
				else if (builtin_type == BuiltInPrimitiveLineIndicesEXT)
					set_name(var.self, "gl_PrimitiveLineIndicesEXT");
				else if (builtin_type == BuiltInPrimitiveTriangleIndicesEXT)
					set_name(var.self, "gl_PrimitiveTriangleIndicesEXT");
			}
		}
	});
}